

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

int64_t __thiscall llvm::DataExtractor::getSLEB128(DataExtractor *this,uint64_t *offset_ptr)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = *offset_ptr;
  uVar7 = (this->Data).Length;
  lVar8 = uVar7 - uVar2;
  if (uVar7 < uVar2) {
    __assert_fail("*offset_ptr <= Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                  ,0xc4,"int64_t llvm::DataExtractor::getSLEB128(uint64_t *) const");
  }
  pcVar3 = (this->Data).Data;
  uVar7 = 0;
  uVar6 = 0;
  uVar4 = 0;
  pbVar5 = (byte *)(pcVar3 + uVar2);
  do {
    bVar9 = lVar8 == 0;
    if (bVar9 && pcVar3 != (char *)0x0) goto LAB_00d4faf5;
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)uVar4 & 0x3f);
    uVar4 = uVar4 + 7;
    lVar8 = lVar8 + -1;
  } while ((char)bVar1 < '\0');
  uVar7 = -1L << ((byte)uVar4 & 0x3f);
  if (bVar1 < 0x40) {
    uVar7 = 0;
  }
  if (0x3f < uVar4) {
    uVar7 = 0;
  }
  uVar7 = uVar6 | uVar7;
LAB_00d4faf5:
  if (bVar9 && pcVar3 != (char *)0x0) {
    uVar7 = 0;
  }
  else {
    *offset_ptr = (uint)((int)pbVar5 - (int)(pcVar3 + uVar2)) + uVar2;
  }
  return uVar7;
}

Assistant:

int64_t DataExtractor::getSLEB128(uint64_t *offset_ptr) const {
  assert(*offset_ptr <= Data.size());

  const char *error;
  unsigned bytes_read;
  int64_t result = decodeSLEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error)
    return 0;
  *offset_ptr += bytes_read;
  return result;
}